

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void vkt::shaderexecutor::
     ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  undefined7 uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  Vector<tcu::Interval,_4> *pVVar6;
  IVal *pIVar7;
  long lVar8;
  byte bVar9;
  undefined1 auStack_98 [8];
  IVal local_90;
  
  bVar9 = 0;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  bVar3 = false;
  lVar8 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    lVar4 = 8;
    do {
      auStack_98[lVar4] = 0;
      *(undefined4 *)(&local_90.m_data[0].m_hasNaN + lVar4) = 0;
      *(undefined4 *)(&local_90.m_data[0].field_0x4 + lVar4) = 0x7ff00000;
      *(undefined4 *)((long)&local_90.m_data[0].m_lo + lVar4) = 0;
      *(undefined4 *)((long)&local_90.m_data[0].m_lo + lVar4 + 4) = 0xfff00000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x68);
    pVVar6 = (ival->m_data).m_data + lVar8;
    pIVar7 = &local_90;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *(undefined7 *)&pVVar6->m_data[0].field_0x1;
      pIVar7->m_data[0].m_hasNaN = pVVar6->m_data[0].m_hasNaN;
      *(undefined7 *)&pIVar7->m_data[0].field_0x1 = uVar1;
      pVVar6 = (Vector<tcu::Interval,_4> *)((long)pVVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      pIVar7 = (IVal *)((long)pIVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doPrintIVal
              (fmt,&local_90,os);
    lVar8 = 1;
    bVar3 = true;
    bVar2 = false;
  } while (bVar5);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}